

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

void __thiscall el::base::LogFormat::LogFormat(LogFormat *this,LogFormat *logFormat)

{
  (this->super_Loggable)._vptr_Loggable = (_func_int **)&PTR__LogFormat_0019b2d0;
  this->m_level = logFormat->m_level;
  std::__cxx11::string::string((string *)&this->m_userFormat,(string *)&logFormat->m_userFormat);
  std::__cxx11::string::string((string *)&this->m_format,(string *)&logFormat->m_format);
  std::__cxx11::string::string
            ((string *)&this->m_dateTimeFormat,(string *)&logFormat->m_dateTimeFormat);
  this->m_flags = logFormat->m_flags;
  std::__cxx11::string::string((string *)&this->m_currentUser,(string *)&logFormat->m_currentUser);
  std::__cxx11::string::string((string *)&this->m_currentHost,(string *)&logFormat->m_currentHost);
  return;
}

Assistant:

LogFormat::LogFormat(const LogFormat& logFormat):
  m_level(logFormat.m_level),
  m_userFormat(logFormat.m_userFormat),
  m_format(logFormat.m_format),
  m_dateTimeFormat(logFormat.m_dateTimeFormat),
  m_flags(logFormat.m_flags),
  m_currentUser(logFormat.m_currentUser),
  m_currentHost(logFormat.m_currentHost) {
}